

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall vector<NodeList<Node>_>::vector(vector<NodeList<Node>_> *this)

{
  undefined8 *puVar1;
  NodeList<Node> *local_28;
  vector<NodeList<Node>_> *this_local;
  
  puVar1 = (undefined8 *)operator_new__(0x20);
  *puVar1 = 1;
  local_28 = (NodeList<Node> *)(puVar1 + 1);
  do {
    NodeList<Node>::NodeList(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (NodeList<Node> *)(puVar1 + 4));
  this->vect = (NodeList<Node> *)(puVar1 + 1);
  this->_size = 0;
  this->_capacity = 1;
  return;
}

Assistant:

vector() {
        vect = new T[1]();
        _size = 0;
        _capacity = 1;
    }